

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O3

stream * opentempfile(char *name,char *mode)

{
  filestream *this;
  FILE *pFVar1;
  
  findfile(name,mode);
  this = (filestream *)operator_new(0x10);
  (this->super_stream)._vptr_stream = (_func_int **)&PTR__filestream_00181b38;
  pFVar1 = tmpfile64();
  this->file = (FILE *)pFVar1;
  if (pFVar1 == (FILE *)0x0) {
    filestream::~filestream(this);
    this = (filestream *)0x0;
  }
  return &this->super_stream;
}

Assistant:

stream *opentempfile(const char *name, const char *mode)
{
    const char *found = findfile(name, mode);
    filestream *file = new filestream;
    if(!file->opentemp(found ? found : name, mode)) { delete file; return NULL; }
    return file;
}